

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O1

bool_t memEq(void *buf1,void *buf2,size_t count)

{
  size_t sVar1;
  ulong uVar2;
  
  uVar2 = 0;
  if (7 < count) {
    do {
      uVar2 = uVar2 | *buf2 ^ *buf1;
      buf1 = (void *)((long)buf1 + 8);
      buf2 = (void *)((long)buf2 + 8);
      count = count - 8;
    } while (7 < count);
  }
  if (count != 0) {
    sVar1 = 0;
    do {
      uVar2 = uVar2 | *(byte *)((long)buf2 + sVar1) ^ *(byte *)((long)buf1 + sVar1);
      sVar1 = sVar1 + 1;
    } while (count != sVar1);
  }
  return (bool_t)(uVar2 == 0);
}

Assistant:

bool_t SAFE(memEq)(const void* buf1, const void* buf2, size_t count)
{
	register word diff = 0;
	ASSERT(memIsValid(buf1, count));
	ASSERT(memIsValid(buf2, count));
	for (; count >= O_PER_W; count -= O_PER_W)
	{
		diff |= *(const word*)buf1 ^ *(const word*)buf2;
		buf1 = (const word*)buf1 + 1;
		buf2 = (const word*)buf2 + 1;
	}
	while (count--)
	{
		diff |= *(const octet*)buf1 ^ *(const octet*)buf2;
		buf1 = (const octet*)buf1 + 1;
		buf2 = (const octet*)buf2 + 1;
	}
	return wordEq(diff, 0);
}